

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O3

void __thiscall
fasttext::DenseMatrix::averageRowsToVector
          (DenseMatrix *this,Vector *x,vector<int,_std::allocator<int>_> *rows)

{
  long lVar1;
  uint *puVar2;
  uint *puVar3;
  undefined1 auVar4 [16];
  undefined1 in_ZMM0 [64];
  
  lVar1 = (this->super_Matrix).n_;
  if (lVar1 < 0x40) {
    if (lVar1 == 0x10) {
      averageRowsFast<16u>(x,rows,this);
      return;
    }
    if (lVar1 == 0x20) {
      averageRowsFast<32u>(x,rows,this);
      return;
    }
  }
  else {
    if (lVar1 == 0x40) {
      averageRowsFast<64u>(x,rows,this);
      return;
    }
    if (lVar1 == 0x100) {
      averageRowsFast<256u>(x,rows,this);
      return;
    }
    if (lVar1 == 0x200) {
      averageRowsFast<512u>(x,rows,this);
      return;
    }
  }
  Vector::zero(x);
  auVar4 = in_ZMM0._0_16_;
  puVar2 = (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  puVar3 = puVar2;
  if (puVar2 != (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish) {
    do {
      (*(this->super_Matrix)._vptr_Matrix[4])(this,x,(ulong)*puVar3);
      auVar4 = in_ZMM0._0_16_;
      puVar3 = puVar3 + 1;
    } while (puVar3 != (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish);
    puVar2 = (uint *)(rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
  }
  auVar4 = vcvtusi2sd_avx512f(auVar4,(long)puVar3 - (long)puVar2 >> 2);
  Vector::mul(x,(float)(1.0 / auVar4._0_8_));
  return;
}

Assistant:

void DenseMatrix::averageRowsToVector(Vector& x, const std::vector<int32_t>& rows) const {
#if defined(__AVX512F__) || defined(__AVX__) || defined(__SSE__)
  switch (cols()) {
    case 512:
      // Maximum number that can fit all in registers on AVX512F.
      averageRowsFast<512>(x, rows, *this);
      return;
    case 256:
      averageRowsFast<256>(x, rows, *this);
      return;
    case 64:
      averageRowsFast<64>(x, rows, *this);
      return;
    case 32:
      averageRowsFast<32>(x, rows, *this);
      return;
    case 16:
      averageRowsFast<16>(x, rows, *this);
      return;
  }
#endif
  x.zero();
  for (auto it = rows.cbegin(); it != rows.cend(); ++it) {
    addRowToVector(x, *it);
  }
  x.mul(1.0 / rows.size());
}